

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O0

bool __thiscall
tinyusdz::crate::CrateReader::BuildDecompressedPathsImpl
          (CrateReader *this,BuildDecompressedPathsArg *arg)

{
  uint uVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  vector<int,_std::allocator<int>_> *this_02;
  ulong uVar2;
  undefined1 auVar3 [8];
  undefined1 auVar4 [8];
  ulong uVar5;
  size_t sVar6;
  bool bVar7;
  bool bVar8;
  size_type sVar9;
  ostream *poVar10;
  uint *puVar11;
  reference pvVar12;
  string *psVar13;
  reference pvVar14;
  reference pvVar15;
  ulong uVar16;
  reference pvVar17;
  reference rhs;
  unsigned_long *in_R8;
  bool local_1ce1;
  uint local_1c8c;
  string local_1c60;
  ostringstream local_1c40 [8];
  ostringstream ss_e_13;
  string local_1ac8;
  ostringstream local_1aa8 [8];
  ostringstream ss_e_12;
  size_t idx_2;
  ostringstream local_1908 [8];
  ostringstream ss_e_11;
  size_t idx_3;
  value_type local_1780;
  string local_1778;
  ostringstream local_1758 [8];
  ostringstream ss_e_10;
  ulong local_15e0;
  size_t subtreeEndIdx;
  bool has_sibling;
  ulong uStack_15d0;
  bool has_child;
  size_t subtreeIdx;
  size_t subtreeStartIdx;
  ostringstream local_15a0 [8];
  ostringstream ss_e_9;
  size_t siblingIndex;
  undefined1 local_1418 [6];
  bool hasSibling;
  bool hasChild;
  ostringstream local_13f8 [8];
  ostringstream ss_e_8;
  reference local_1280;
  allocator local_1269;
  string local_1268;
  Path local_1248;
  Path local_1178;
  string local_10a8;
  allocator local_1081;
  string local_1080 [32];
  string local_1060;
  ostringstream local_1040 [8];
  ostringstream ss_e_7;
  reference local_ec8;
  string local_eb8;
  ostringstream local_e98 [8];
  ostringstream ss_e_6;
  string local_d20;
  ostringstream local_d00 [8];
  ostringstream ss_e_5;
  undefined1 local_b88 [8];
  size_t idx_1;
  value_type *elemToken;
  ostringstream local_b58 [8];
  ostringstream ss_e_4;
  uint32_t tokenIndex;
  undefined1 local_9d0 [3];
  bool isPrimPropertyPath;
  int32_t _tokenIndex;
  ostringstream local_9b0 [8];
  ostringstream ss_e_3;
  reference local_838;
  string local_828;
  allocator local_801;
  string local_800 [32];
  string local_7e0;
  ostringstream local_7c0 [8];
  ostringstream ss_e_2;
  reference local_648;
  string local_638;
  ostringstream local_618 [8];
  ostringstream ss_e_1;
  undefined1 local_4a0 [8];
  size_t idx;
  ostringstream local_478 [8];
  ostringstream ss_e;
  ulong local_300;
  size_t thisIndex;
  size_t endIndex;
  size_t startIndex;
  size_t nIter;
  stack<tinyusdz::Path,_std::deque<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>
  parentPathStack;
  stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> endIndexStack;
  stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> startIndexStack;
  size_t maxIter;
  Path rootPath;
  vector<bool,_std::allocator<bool>_> *visit_table;
  vector<int,_std::allocator<int>_> *jumps;
  vector<int,_std::allocator<int>_> *elementTokenIndexes;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pathIndexes;
  undefined1 local_f0 [8];
  Path parentPath;
  BuildDecompressedPathsArg *arg_local;
  CrateReader *this_local;
  
  if (arg == (BuildDecompressedPathsArg *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    parentPath._200_8_ = arg;
    Path::Path((Path *)local_f0,&arg->parentPath);
    if (*(long *)parentPath._200_8_ == 0) {
      this_local._7_1_ = false;
    }
    else if (*(long *)(parentPath._200_8_ + 8) == 0) {
      this_local._7_1_ = false;
    }
    else if (*(long *)(parentPath._200_8_ + 0x10) == 0) {
      this_local._7_1_ = false;
    }
    else if (*(long *)(parentPath._200_8_ + 0x18) == 0) {
      this_local._7_1_ = false;
    }
    else {
      this_00 = *(vector<unsigned_int,_std::allocator<unsigned_int>_> **)parentPath._200_8_;
      this_01 = *(vector<int,_std::allocator<int>_> **)(parentPath._200_8_ + 8);
      this_02 = *(vector<int,_std::allocator<int>_> **)(parentPath._200_8_ + 0x10);
      rootPath._200_8_ = *(undefined8 *)(parentPath._200_8_ + 0x18);
      Path::make_root_path();
      uVar2 = (this->_config).maxPathIndicesDecodeIteration;
      ::std::stack<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>>::
      stack<std::deque<unsigned_long,std::allocator<unsigned_long>>,void>
                ((stack<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>> *)
                 &endIndexStack.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_node);
      ::std::stack<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>>::
      stack<std::deque<unsigned_long,std::allocator<unsigned_long>>,void>
                ((stack<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>> *)
                 &parentPathStack.c.
                  super__Deque_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_node);
      ::std::stack<tinyusdz::Path,std::deque<tinyusdz::Path,std::allocator<tinyusdz::Path>>>::
      stack<std::deque<tinyusdz::Path,std::allocator<tinyusdz::Path>>,void>
                ((stack<tinyusdz::Path,std::deque<tinyusdz::Path,std::allocator<tinyusdz::Path>>> *)
                 &nIter);
      startIndex = 0;
      endIndex = *(size_t *)(parentPath._200_8_ + 0x20);
      thisIndex = *(size_t *)(parentPath._200_8_ + 0x28);
      for (; startIndex < uVar2; startIndex = startIndex + 1) {
        for (local_300 = endIndex; local_300 < thisIndex + 1; local_300 = local_300 + 1) {
          bVar7 = Path::is_empty((Path *)local_f0);
          uVar16 = local_300;
          if (bVar7) {
            Path::operator=((Path *)local_f0,(Path *)&maxIter);
            uVar16 = local_300;
            sVar9 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this_00);
            if (sVar9 <= uVar16) {
              ::std::__cxx11::ostringstream::ostringstream(local_478);
              poVar10 = ::std::operator<<((ostream *)local_478,"[error]");
              poVar10 = ::std::operator<<(poVar10,
                                          "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                         );
              poVar10 = ::std::operator<<(poVar10,":");
              poVar10 = ::std::operator<<(poVar10,"BuildDecompressedPathsImpl");
              poVar10 = ::std::operator<<(poVar10,"():");
              poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0x118f);
              ::std::operator<<(poVar10," ");
              poVar10 = ::std::operator<<((ostream *)local_478,"Index exceeds pathIndexes.size()");
              ::std::operator<<(poVar10,"\n");
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)&idx);
              ::std::__cxx11::string::~string((string *)&idx);
              ::std::__cxx11::ostringstream::~ostringstream(local_478);
              this_local._7_1_ = false;
              goto LAB_00234a5e;
            }
            pvVar12 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                (this_00,local_300);
            uVar1 = *pvVar12;
            local_4a0 = (undefined1  [8])(ulong)uVar1;
            sVar9 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size
                              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                               &this->_paths);
            auVar3 = local_4a0;
            if (sVar9 <= uVar1) {
              ::std::__cxx11::ostringstream::ostringstream(local_618);
              poVar10 = ::std::operator<<((ostream *)local_618,"[error]");
              poVar10 = ::std::operator<<(poVar10,
                                          "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                         );
              poVar10 = ::std::operator<<(poVar10,":");
              poVar10 = ::std::operator<<(poVar10,"BuildDecompressedPathsImpl");
              poVar10 = ::std::operator<<(poVar10,"():");
              poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0x1195);
              ::std::operator<<(poVar10," ");
              poVar10 = ::std::operator<<((ostream *)local_618,"Index is out-of-range");
              ::std::operator<<(poVar10,"\n");
              ::std::__cxx11::ostringstream::str();
              PushError(this,&local_638);
              ::std::__cxx11::string::~string((string *)&local_638);
              ::std::__cxx11::ostringstream::~ostringstream(local_618);
              this_local._7_1_ = false;
              goto LAB_00234a5e;
            }
            sVar9 = ::std::vector<bool,_std::allocator<bool>_>::size
                              ((vector<bool,_std::allocator<bool>_> *)rootPath._200_8_);
            if ((ulong)auVar3 < sVar9) {
              local_648 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                                    ((vector<bool,_std::allocator<bool>_> *)rootPath._200_8_,
                                     (size_type)local_4a0);
              bVar7 = ::std::_Bit_reference::operator_cast_to_bool(&local_648);
              if (bVar7) {
                ::std::__cxx11::ostringstream::ostringstream(local_7c0);
                poVar10 = ::std::operator<<((ostream *)local_7c0,"[error]");
                poVar10 = ::std::operator<<(poVar10,
                                            "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                           );
                poVar10 = ::std::operator<<(poVar10,"[Crate]");
                poVar10 = ::std::operator<<(poVar10,":");
                poVar10 = ::std::operator<<(poVar10,"BuildDecompressedPathsImpl");
                poVar10 = ::std::operator<<(poVar10,"():");
                poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0x119b);
                ::std::operator<<(poVar10," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_800,
                           "Circular referencing of Path index {}(thisIndex {}) detected. Invalid Paths data."
                           ,&local_801);
                fmt::format<unsigned_long,unsigned_long>
                          (&local_7e0,(fmt *)local_800,(string *)local_4a0,&local_300,in_R8);
                poVar10 = ::std::operator<<((ostream *)local_7c0,(string *)&local_7e0);
                ::std::operator<<(poVar10,"\n");
                ::std::__cxx11::string::~string((string *)&local_7e0);
                ::std::__cxx11::string::~string(local_800);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_801);
                ::std::__cxx11::ostringstream::str();
                PushError(this,&local_828);
                ::std::__cxx11::string::~string((string *)&local_828);
                this_local._7_1_ = false;
                ::std::__cxx11::ostringstream::~ostringstream(local_7c0);
                goto LAB_00234a5e;
              }
            }
            pvVar14 = ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator[]
                                (&this->_paths,(size_type)local_4a0);
            Path::operator=(pvVar14,(Path *)local_f0);
            local_838 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                                  ((vector<bool,_std::allocator<bool>_> *)rootPath._200_8_,
                                   (size_type)local_4a0);
            ::std::_Bit_reference::operator=(&local_838,true);
          }
          else {
            sVar9 = ::std::vector<int,_std::allocator<int>_>::size(this_01);
            if (sVar9 <= uVar16) {
              ::std::__cxx11::ostringstream::ostringstream(local_9b0);
              poVar10 = ::std::operator<<((ostream *)local_9b0,"[error]");
              poVar10 = ::std::operator<<(poVar10,
                                          "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                         );
              poVar10 = ::std::operator<<(poVar10,":");
              poVar10 = ::std::operator<<(poVar10,"BuildDecompressedPathsImpl");
              poVar10 = ::std::operator<<(poVar10,"():");
              poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0x11a3);
              ::std::operator<<(poVar10," ");
              poVar10 = ::std::operator<<((ostream *)local_9b0,
                                          "Index exceeds elementTokenIndexes.size()");
              ::std::operator<<(poVar10,"\n");
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)local_9d0);
              ::std::__cxx11::string::~string((string *)local_9d0);
              ::std::__cxx11::ostringstream::~ostringstream(local_9b0);
              this_local._7_1_ = false;
              goto LAB_00234a5e;
            }
            puVar11 = (uint *)::std::vector<int,_std::allocator<int>_>::operator[]
                                        (this_01,local_300);
            local_1c8c = *puVar11;
            bVar7 = -1 < (int)local_1c8c;
            if (!bVar7) {
              local_1c8c = -local_1c8c;
            }
            sVar9 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                              ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                               &this->_tokens);
            if (sVar9 <= local_1c8c) {
              ::std::__cxx11::ostringstream::ostringstream(local_b58);
              poVar10 = ::std::operator<<((ostream *)local_b58,"[error]");
              poVar10 = ::std::operator<<(poVar10,
                                          "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                         );
              poVar10 = ::std::operator<<(poVar10,":");
              poVar10 = ::std::operator<<(poVar10,"BuildDecompressedPathsImpl");
              poVar10 = ::std::operator<<(poVar10,"():");
              poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0x11ae);
              ::std::operator<<(poVar10," ");
              poVar10 = ::std::operator<<((ostream *)local_b58,
                                          "Invalid tokenIndex in BuildDecompressedPathsImpl.");
              ::std::operator<<(poVar10,"\n");
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)&elemToken);
              ::std::__cxx11::string::~string((string *)&elemToken);
              ::std::__cxx11::ostringstream::~ostringstream(local_b58);
              this_local._7_1_ = false;
              goto LAB_00234a5e;
            }
            idx_1 = (size_t)::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::
                            operator[](&this->_tokens,(ulong)local_1c8c);
            pvVar12 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                (this_00,local_300);
            uVar1 = *pvVar12;
            local_b88 = (undefined1  [8])(ulong)uVar1;
            sVar9 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size
                              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                               &this->_paths);
            auVar3 = local_b88;
            if (sVar9 <= uVar1) {
              ::std::__cxx11::ostringstream::ostringstream(local_d00);
              poVar10 = ::std::operator<<((ostream *)local_d00,"[error]");
              poVar10 = ::std::operator<<(poVar10,
                                          "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                         );
              poVar10 = ::std::operator<<(poVar10,":");
              poVar10 = ::std::operator<<(poVar10,"BuildDecompressedPathsImpl");
              poVar10 = ::std::operator<<(poVar10,"():");
              poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0x11b7);
              ::std::operator<<(poVar10," ");
              poVar10 = ::std::operator<<((ostream *)local_d00,"Index is out-of-range");
              ::std::operator<<(poVar10,"\n");
              ::std::__cxx11::ostringstream::str();
              PushError(this,&local_d20);
              ::std::__cxx11::string::~string((string *)&local_d20);
              ::std::__cxx11::ostringstream::~ostringstream(local_d00);
              this_local._7_1_ = false;
              goto LAB_00234a5e;
            }
            sVar9 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size
                              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                               &this->_elemPaths);
            auVar4 = local_b88;
            if (sVar9 <= (ulong)auVar3) {
              ::std::__cxx11::ostringstream::ostringstream(local_e98);
              poVar10 = ::std::operator<<((ostream *)local_e98,"[error]");
              poVar10 = ::std::operator<<(poVar10,
                                          "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                         );
              poVar10 = ::std::operator<<(poVar10,":");
              poVar10 = ::std::operator<<(poVar10,"BuildDecompressedPathsImpl");
              poVar10 = ::std::operator<<(poVar10,"():");
              poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0x11bc);
              ::std::operator<<(poVar10," ");
              poVar10 = ::std::operator<<((ostream *)local_e98,"Index is out-of-range");
              ::std::operator<<(poVar10,"\n");
              ::std::__cxx11::ostringstream::str();
              PushError(this,&local_eb8);
              ::std::__cxx11::string::~string((string *)&local_eb8);
              ::std::__cxx11::ostringstream::~ostringstream(local_e98);
              this_local._7_1_ = false;
              goto LAB_00234a5e;
            }
            sVar9 = ::std::vector<bool,_std::allocator<bool>_>::size
                              ((vector<bool,_std::allocator<bool>_> *)rootPath._200_8_);
            if ((ulong)auVar4 < sVar9) {
              local_ec8 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                                    ((vector<bool,_std::allocator<bool>_> *)rootPath._200_8_,
                                     (size_type)local_b88);
              bVar8 = ::std::_Bit_reference::operator_cast_to_bool(&local_ec8);
              if (bVar8) {
                ::std::__cxx11::ostringstream::ostringstream(local_1040);
                poVar10 = ::std::operator<<((ostream *)local_1040,"[error]");
                poVar10 = ::std::operator<<(poVar10,
                                            "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                           );
                poVar10 = ::std::operator<<(poVar10,"[Crate]");
                poVar10 = ::std::operator<<(poVar10,":");
                poVar10 = ::std::operator<<(poVar10,"BuildDecompressedPathsImpl");
                poVar10 = ::std::operator<<(poVar10,"():");
                poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0x11c2);
                ::std::operator<<(poVar10," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_1080,
                           "Circular referencing of Path index {}(thisIndex {}) detected. Invalid Paths data."
                           ,&local_1081);
                fmt::format<unsigned_long,unsigned_long>
                          (&local_1060,(fmt *)local_1080,(string *)local_b88,&local_300,in_R8);
                poVar10 = ::std::operator<<((ostream *)local_1040,(string *)&local_1060);
                ::std::operator<<(poVar10,"\n");
                ::std::__cxx11::string::~string((string *)&local_1060);
                ::std::__cxx11::string::~string(local_1080);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_1081);
                ::std::__cxx11::ostringstream::str();
                PushError(this,&local_10a8);
                ::std::__cxx11::string::~string((string *)&local_10a8);
                this_local._7_1_ = false;
                ::std::__cxx11::ostringstream::~ostringstream(local_1040);
                goto LAB_00234a5e;
              }
            }
            if (bVar7) {
              psVar13 = Token::str_abi_cxx11_((Token *)idx_1);
              Path::AppendElement(&local_1178,(Path *)local_f0,psVar13);
            }
            else {
              psVar13 = Token::str_abi_cxx11_((Token *)idx_1);
              Path::AppendProperty(&local_1178,(Path *)local_f0,psVar13);
            }
            pvVar14 = ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator[]
                                (&this->_paths,(size_type)local_b88);
            Path::operator=(pvVar14,&local_1178);
            Path::~Path(&local_1178);
            psVar13 = Token::str_abi_cxx11_((Token *)idx_1);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)&local_1268,"",&local_1269);
            Path::Path(&local_1248,psVar13,&local_1268);
            pvVar14 = ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator[]
                                (&this->_elemPaths,(size_type)local_b88);
            Path::operator=(pvVar14,&local_1248);
            Path::~Path(&local_1248);
            ::std::__cxx11::string::~string((string *)&local_1268);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_1269);
            local_1280 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                                   ((vector<bool,_std::allocator<bool>_> *)rootPath._200_8_,
                                    (size_type)local_b88);
            ::std::_Bit_reference::operator=(&local_1280,true);
          }
          uVar16 = local_300;
          sVar9 = ::std::vector<int,_std::allocator<int>_>::size(this_02);
          if (sVar9 <= uVar16) {
            ::std::__cxx11::ostringstream::ostringstream(local_13f8);
            poVar10 = ::std::operator<<((ostream *)local_13f8,"[error]");
            poVar10 = ::std::operator<<(poVar10,
                                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                       );
            poVar10 = ::std::operator<<(poVar10,":");
            poVar10 = ::std::operator<<(poVar10,"BuildDecompressedPathsImpl");
            poVar10 = ::std::operator<<(poVar10,"():");
            poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0x11d8);
            ::std::operator<<(poVar10," ");
            poVar10 = ::std::operator<<((ostream *)local_13f8,"Index is out-of-range");
            ::std::operator<<(poVar10,"\n");
            ::std::__cxx11::ostringstream::str();
            PushError(this,(string *)local_1418);
            ::std::__cxx11::string::~string((string *)local_1418);
            ::std::__cxx11::ostringstream::~ostringstream(local_13f8);
            this_local._7_1_ = false;
            goto LAB_00234a5e;
          }
          pvVar15 = ::std::vector<int,_std::allocator<int>_>::operator[](this_02,local_300);
          bVar7 = true;
          if (*pvVar15 < 1) {
            pvVar15 = ::std::vector<int,_std::allocator<int>_>::operator[](this_02,local_300);
            bVar7 = *pvVar15 == -1;
          }
          pvVar15 = ::std::vector<int,_std::allocator<int>_>::operator[](this_02,local_300);
          uVar16 = local_300;
          if (bVar7) {
            if (-1 < *pvVar15) {
              pvVar15 = ::std::vector<int,_std::allocator<int>_>::operator[](this_02,local_300);
              uVar16 = uVar16 + (long)*pvVar15;
              sVar9 = ::std::vector<int,_std::allocator<int>_>::size(this_02);
              uVar5 = uVar16;
              sVar6 = uVar16;
              if (sVar9 <= uVar16) {
                ::std::__cxx11::ostringstream::ostringstream(local_15a0);
                poVar10 = ::std::operator<<((ostream *)local_15a0,"[error]");
                poVar10 = ::std::operator<<(poVar10,
                                            "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                           );
                poVar10 = ::std::operator<<(poVar10,":");
                poVar10 = ::std::operator<<(poVar10,"BuildDecompressedPathsImpl");
                poVar10 = ::std::operator<<(poVar10,"():");
                poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0x11e6);
                ::std::operator<<(poVar10," ");
                poVar10 = ::std::operator<<((ostream *)local_15a0,"jump index corrupted.");
                ::std::operator<<(poVar10,"\n");
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)&subtreeStartIdx);
                ::std::__cxx11::string::~string((string *)&subtreeStartIdx);
                this_local._7_1_ = false;
                ::std::__cxx11::ostringstream::~ostringstream(local_15a0);
                goto LAB_00234a5e;
              }
              while (subtreeIdx = sVar6, uStack_15d0 = uVar5, uVar5 = uStack_15d0,
                    sVar9 = ::std::vector<int,_std::allocator<int>_>::size(this_02), uVar5 < sVar9)
              {
                pvVar15 = ::std::vector<int,_std::allocator<int>_>::operator[](this_02,uStack_15d0);
                local_1ce1 = true;
                if (*pvVar15 < 1) {
                  pvVar15 = ::std::vector<int,_std::allocator<int>_>::operator[]
                                      (this_02,uStack_15d0);
                  local_1ce1 = *pvVar15 == -1;
                }
                subtreeEndIdx._7_1_ = local_1ce1;
                pvVar15 = ::std::vector<int,_std::allocator<int>_>::operator[](this_02,uStack_15d0);
                subtreeEndIdx._6_1_ = -1 < *pvVar15;
                if (((subtreeEndIdx._7_1_ & 1) == 0) && (!(bool)subtreeEndIdx._6_1_)) break;
                sVar6 = subtreeIdx;
                uVar5 = uStack_15d0 + 1;
              }
              uVar5 = uStack_15d0;
              local_15e0 = uStack_15d0;
              sVar9 = ::std::vector<int,_std::allocator<int>_>::size(this_02);
              if (sVar9 <= uVar5) {
                ::std::__cxx11::ostringstream::ostringstream(local_1758);
                poVar10 = ::std::operator<<((ostream *)local_1758,"[error]");
                poVar10 = ::std::operator<<(poVar10,
                                            "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                           );
                poVar10 = ::std::operator<<(poVar10,":");
                poVar10 = ::std::operator<<(poVar10,"BuildDecompressedPathsImpl");
                poVar10 = ::std::operator<<(poVar10,"():");
                poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0x11fb);
                ::std::operator<<(poVar10," ");
                poVar10 = ::std::operator<<((ostream *)local_1758,"jump indices seems corrupted.");
                ::std::operator<<(poVar10,"\n");
                ::std::__cxx11::ostringstream::str();
                PushError(this,&local_1778);
                ::std::__cxx11::string::~string((string *)&local_1778);
                this_local._7_1_ = false;
                ::std::__cxx11::ostringstream::~ostringstream(local_1758);
                goto LAB_00234a5e;
              }
              if (subtreeIdx <= local_15e0) {
                pvVar15 = ::std::vector<int,_std::allocator<int>_>::operator[](this_02,local_300);
                if (1 < *pvVar15) {
                  local_1780 = local_300 + 1;
                  ::std::
                  stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::
                  push((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)&endIndexStack.c.
                           super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                           super__Deque_impl_data._M_finish._M_node,&local_1780);
                  idx_3 = uVar16 - 1;
                  ::std::
                  stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::
                  push((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)&parentPathStack.c.
                           super__Deque_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                           _M_impl.super__Deque_impl_data._M_finish._M_node,&idx_3);
                  pvVar12 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                      (this_00,local_300);
                  uVar1 = *pvVar12;
                  sVar9 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size
                                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                                     &this->_paths);
                  if (sVar9 <= uVar1) {
                    ::std::__cxx11::ostringstream::ostringstream(local_1908);
                    poVar10 = ::std::operator<<((ostream *)local_1908,"[error]");
                    poVar10 = ::std::operator<<(poVar10,
                                                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                               );
                    poVar10 = ::std::operator<<(poVar10,":");
                    poVar10 = ::std::operator<<(poVar10,"BuildDecompressedPathsImpl");
                    poVar10 = ::std::operator<<(poVar10,"():");
                    poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0x120d);
                    ::std::operator<<(poVar10," ");
                    poVar10 = ::std::operator<<((ostream *)local_1908,"Index is out-of-range");
                    ::std::operator<<(poVar10,"\n");
                    ::std::__cxx11::ostringstream::str();
                    PushError(this,(string *)&idx_2);
                    ::std::__cxx11::string::~string((string *)&idx_2);
                    ::std::__cxx11::ostringstream::~ostringstream(local_1908);
                    this_local._7_1_ = false;
                    goto LAB_00234a5e;
                  }
                  pvVar14 = ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::
                            operator[](&this->_paths,(ulong)uVar1);
                  ::std::
                  stack<tinyusdz::Path,_std::deque<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>
                  ::push((stack<tinyusdz::Path,_std::deque<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>
                          *)&nIter,pvVar14);
                }
                ::std::
                stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::
                push((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                      *)&endIndexStack.c.
                         super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Deque_impl_data._M_finish._M_node,&subtreeIdx);
                ::std::
                stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::
                push((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                      *)&parentPathStack.c.
                         super__Deque_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                         super__Deque_impl_data._M_finish._M_node,&local_15e0);
                ::std::
                stack<tinyusdz::Path,_std::deque<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>
                ::push((stack<tinyusdz::Path,_std::deque<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>
                        *)&nIter,(value_type *)local_f0);
                startIndex = startIndex + 1;
                break;
              }
            }
            pvVar12 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                (this_00,local_300);
            uVar1 = *pvVar12;
            sVar9 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size
                              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                               &this->_paths);
            if (sVar9 <= uVar1) {
              ::std::__cxx11::ostringstream::ostringstream(local_1aa8);
              poVar10 = ::std::operator<<((ostream *)local_1aa8,"[error]");
              poVar10 = ::std::operator<<(poVar10,
                                          "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                         );
              poVar10 = ::std::operator<<(poVar10,":");
              poVar10 = ::std::operator<<(poVar10,"BuildDecompressedPathsImpl");
              poVar10 = ::std::operator<<(poVar10,"():");
              poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0x1225);
              ::std::operator<<(poVar10," ");
              poVar10 = ::std::operator<<((ostream *)local_1aa8,"Index is out-of-range");
              ::std::operator<<(poVar10,"\n");
              ::std::__cxx11::ostringstream::str();
              PushError(this,&local_1ac8);
              ::std::__cxx11::string::~string((string *)&local_1ac8);
              ::std::__cxx11::ostringstream::~ostringstream(local_1aa8);
              this_local._7_1_ = false;
              goto LAB_00234a5e;
            }
            pvVar14 = ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator[]
                                (&this->_paths,(ulong)uVar1);
            Path::operator=((Path *)local_f0,pvVar14);
          }
        }
        bVar7 = ::std::
                stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::
                empty((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                       *)&endIndexStack.c.
                          super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Deque_impl_data._M_finish._M_node);
        if (bVar7) break;
        pvVar17 = ::std::
                  stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::
                  top((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                       *)&endIndexStack.c.
                          super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Deque_impl_data._M_finish._M_node);
        endIndex = *pvVar17;
        ::std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::pop
                  ((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                    *)&endIndexStack.c.
                       super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Deque_impl_data._M_finish._M_node);
        pvVar17 = ::std::
                  stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::
                  top((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                       *)&parentPathStack.c.
                          super__Deque_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl
                          .super__Deque_impl_data._M_finish._M_node);
        thisIndex = *pvVar17;
        ::std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::pop
                  ((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                    *)&parentPathStack.c.
                       super__Deque_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                       super__Deque_impl_data._M_finish._M_node);
        rhs = ::std::
              stack<tinyusdz::Path,_std::deque<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>::
              top((stack<tinyusdz::Path,_std::deque<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>
                   *)&nIter);
        Path::operator=((Path *)local_f0,rhs);
        ::std::stack<tinyusdz::Path,_std::deque<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>::
        pop((stack<tinyusdz::Path,_std::deque<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_> *)
            &nIter);
      }
      if (startIndex < uVar2) {
        this_local._7_1_ = true;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_1c40);
        poVar10 = ::std::operator<<((ostream *)local_1c40,"[error]");
        poVar10 = ::std::operator<<(poVar10,
                                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                   );
        poVar10 = ::std::operator<<(poVar10,":");
        poVar10 = ::std::operator<<(poVar10,"BuildDecompressedPathsImpl");
        poVar10 = ::std::operator<<(poVar10,"():");
        poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0x1241);
        ::std::operator<<(poVar10," ");
        poVar10 = ::std::operator<<((ostream *)local_1c40,"PathIndex tree Too deep.");
        ::std::operator<<(poVar10,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,&local_1c60);
        ::std::__cxx11::string::~string((string *)&local_1c60);
        this_local._7_1_ = false;
        ::std::__cxx11::ostringstream::~ostringstream(local_1c40);
      }
LAB_00234a5e:
      ::std::stack<tinyusdz::Path,_std::deque<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>::
      ~stack((stack<tinyusdz::Path,_std::deque<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_> *)
             &nIter);
      ::std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::
      ~stack((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             &parentPathStack.c.super__Deque_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node);
      ::std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::
      ~stack((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             &endIndexStack.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node);
      Path::~Path((Path *)&maxIter);
    }
    Path::~Path((Path *)local_f0);
  }
  return this_local._7_1_;
}

Assistant:

bool CrateReader::BuildDecompressedPathsImpl(
    BuildDecompressedPathsArg *arg) {

  if (!arg) {
    return false;
  }

  Path parentPath = arg->parentPath;
  if (!arg->pathIndexes) {
    return false;
  }
  if (!arg->elementTokenIndexes) {
    return false;
  }
  if (!arg->jumps) {
    return false;
  }
  if (!arg->visit_table) {
    return false;
  }
  auto &pathIndexes = *arg->pathIndexes;
  auto &elementTokenIndexes = *arg->elementTokenIndexes;
  auto &jumps = *arg->jumps;
  auto &visit_table = *arg->visit_table;

  auto rootPath = Path::make_root_path();

  const size_t maxIter = _config.maxPathIndicesDecodeIteration;

  std::stack<size_t> startIndexStack;
  std::stack<size_t> endIndexStack;
  std::stack<Path> parentPathStack;

  size_t nIter = 0;

  size_t startIndex = arg->startIndex;
  size_t endIndex = arg->endIndex;

  while (nIter < maxIter) {

    DCOUT("startIndex = " << startIndex << ", endIdx = " << endIndex);

    for (size_t thisIndex = startIndex; thisIndex < (endIndex + 1); thisIndex++) {
      //auto thisIndex = curIndex++;
      DCOUT("thisIndex = " << thisIndex << ", pathIndexes.size = " << pathIndexes.size());
      if (parentPath.is_empty()) {
        // root node.
        // Assume single root node in the scene.
        DCOUT("paths[" << pathIndexes[thisIndex]
                       << "] is parent. name = " << parentPath.full_path_name());
        parentPath = rootPath;

        if (thisIndex >= pathIndexes.size()) {
          PUSH_ERROR("Index exceeds pathIndexes.size()");
          return false;
        }

        size_t idx = pathIndexes[thisIndex];
        if (idx >= _paths.size()) {
          PUSH_ERROR("Index is out-of-range");
          return false;
        }

        if (idx < visit_table.size()) {
          if (visit_table[idx]) {
            PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("Circular referencing of Path index {}(thisIndex {}) detected. Invalid Paths data.", idx, thisIndex));
          }
        }

        _paths[idx] = parentPath;
        visit_table[idx] = true;
      } else {
        if (thisIndex >= elementTokenIndexes.size()) {
          PUSH_ERROR("Index exceeds elementTokenIndexes.size()");
          return false;
        }
        int32_t _tokenIndex = elementTokenIndexes[thisIndex];
        DCOUT("elementTokenIndex = " << _tokenIndex);
        bool isPrimPropertyPath = _tokenIndex < 0;
        // ~0 returns -2147483648, so cast to uint32
        uint32_t tokenIndex = uint32_t(isPrimPropertyPath ? -_tokenIndex : _tokenIndex);

        DCOUT("tokenIndex = " << tokenIndex << ", _tokens.size = " << _tokens.size());
        if (tokenIndex >= _tokens.size()) {
          PUSH_ERROR("Invalid tokenIndex in BuildDecompressedPathsImpl.");
          return false;
        }
        auto const &elemToken = _tokens[size_t(tokenIndex)];
        DCOUT("elemToken = " << elemToken);
        DCOUT("[" << pathIndexes[thisIndex] << "].append = " << elemToken);

        size_t idx = pathIndexes[thisIndex];
        if (idx >= _paths.size()) {
          PUSH_ERROR("Index is out-of-range");
          return false;
        }

        if (idx >= _elemPaths.size()) {
          PUSH_ERROR("Index is out-of-range");
          return false;
        }

        if (idx < visit_table.size()) {
          if (visit_table[idx]) {
            PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("Circular referencing of Path index {}(thisIndex {}) detected. Invalid Paths data.", idx, thisIndex));
          }
        }

        // Reconstruct full path
        _paths[idx] =
            isPrimPropertyPath ? parentPath.AppendProperty(elemToken.str())
                               : parentPath.AppendElement(elemToken.str()); // prim, variantSelection, etc.

        // also set leaf path for 'primChildren' check
        _elemPaths[idx] = Path(elemToken.str(), "");
        //_paths[pathIndexes[thisIndex]].SetLocalPart(elemToken.str());

        visit_table[idx] = true;
      }

      // If we have either a child or a sibling but not both, then just
      // continue to the neighbor.  If we have both then spawn a task for the
      // sibling and do the child ourself.  We think that our path trees tend
      // to be broader more often than deep.

      if (thisIndex >= jumps.size()) {
        PUSH_ERROR("Index is out-of-range");
        return false;
      }

      bool hasChild = (jumps[thisIndex] > 0) || (jumps[thisIndex] == -1);
      bool hasSibling = (jumps[thisIndex] >= 0);
      DCOUT("hasChild = " << hasChild << ", hasSibling = " << hasSibling);

      if (hasChild) {
        if (hasSibling) {
          // NOTE(syoyo): This recursive call can be parallelized
          auto siblingIndex = thisIndex + size_t(jumps[thisIndex]);

          if (siblingIndex >= jumps.size()) {
            PUSH_ERROR_AND_RETURN("jump index corrupted.");
          }

          // Find subtree end.
          size_t subtreeStartIdx = siblingIndex;
          size_t subtreeIdx = subtreeStartIdx;

          for (; subtreeIdx < jumps.size(); subtreeIdx++) {

            bool has_child = (jumps[subtreeIdx] > 0) || (jumps[subtreeIdx] == -1);
            bool has_sibling = (jumps[subtreeIdx] >= 0);

            if (has_child || has_sibling) {
              continue;
            }
            break;
          }

          size_t subtreeEndIdx = subtreeIdx;
          if (subtreeEndIdx >= jumps.size()) {
            // Guess corrupted.
            PUSH_ERROR_AND_RETURN("jump indices seems corrupted.");
          }

          DCOUT("subtree startIdx " << subtreeStartIdx << ", subtree endIndex " << subtreeEndIdx);

          if (subtreeEndIdx >= subtreeStartIdx) {

            // index range after traversing subtree
            if (jumps[thisIndex] > 1) {

                // Setup stacks to resume loop from [Cont.]
                startIndexStack.push(thisIndex+1);
                // jumps should be always positive, so no siblingIndex < thisIndex
                endIndexStack.push(siblingIndex-1); // endIndex is inclusive so subtract 1.

                {
                  size_t idx = pathIndexes[thisIndex];
                  if (idx >= _paths.size()) {
                    PUSH_ERROR("Index is out-of-range");
                    return false;
                  }

                  parentPathStack.push(_paths[idx]);
                }
            }

            startIndexStack.push(subtreeStartIdx);
            endIndexStack.push(subtreeEndIdx);

            parentPathStack.push(parentPath);
            DCOUT("stack size: " << startIndexStack.size());

            nIter++;

            break; // goto `(A)`
          }

        }

        // [Cont.]
        size_t idx = pathIndexes[thisIndex];
        if (idx >= _paths.size()) {
          PUSH_ERROR("Index is out-of-range");
          return false;
        }

        parentPath = _paths[idx];

      }
    }

    // (A)

    if (startIndexStack.empty()) {
      break; // end traversal
    }

    startIndex = startIndexStack.top();
    startIndexStack.pop();

    endIndex = endIndexStack.top();
    endIndexStack.pop();

    parentPath = parentPathStack.top();
    parentPathStack.pop();

    nIter++;
  }

  if (nIter >= maxIter) {
    PUSH_ERROR_AND_RETURN("PathIndex tree Too deep.");
  }

  return true;
}